

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

void RegisterBlockchainRPCCommands(CRPCTable *t)

{
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffc18;
  allocator<char> local_3c8;
  allocator<char> local_3c7;
  allocator<char> local_3c6;
  allocator<char> local_3c5;
  allocator<char> local_3c4;
  allocator<char> local_3c3;
  allocator<char> local_3c2;
  allocator<char> local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterBlockchainRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterBlockchainRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>(local_40,"blockchain",&local_3c1);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_40);
      std::__cxx11::string::string<std::allocator<char>>(local_60,"blockchain",&local_3c2);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 1,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_60);
      std::__cxx11::string::string<std::allocator<char>>(local_80,"blockchain",&local_3c3);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 2,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_80);
      std::__cxx11::string::string<std::allocator<char>>(local_a0,"blockchain",&local_3c4);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 3,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_a0);
      std::__cxx11::string::string<std::allocator<char>>(local_c0,"blockchain",&local_3c5);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 4,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_c0);
      std::__cxx11::string::string<std::allocator<char>>(local_e0,"blockchain",&local_3c6);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 5,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_e0);
      std::__cxx11::string::string<std::allocator<char>>(local_100,"blockchain",&local_3c7);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 6,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_100);
      std::__cxx11::string::string<std::allocator<char>>(local_120,"blockchain",&local_3c8);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 7,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_120);
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"blockchain",(allocator<char> *)&stack0xfffffffffffffc37);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 8,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_140);
      std::__cxx11::string::string<std::allocator<char>>
                (local_160,"blockchain",(allocator<char> *)&stack0xfffffffffffffc36);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 9,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_160);
      std::__cxx11::string::string<std::allocator<char>>
                (local_180,"blockchain",(allocator<char> *)&stack0xfffffffffffffc35);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 10,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_180);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1a0,"blockchain",(allocator<char> *)&stack0xfffffffffffffc34);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xb,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_1a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1c0,"blockchain",(allocator<char> *)&stack0xfffffffffffffc33);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xc,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_1c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e0,"blockchain",(allocator<char> *)&stack0xfffffffffffffc32);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xd,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_1e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_200,"blockchain",(allocator<char> *)&stack0xfffffffffffffc31);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xe,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_200);
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"blockchain",(allocator<char> *)&stack0xfffffffffffffc30);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0xf,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_220);
      std::__cxx11::string::string<std::allocator<char>>
                (local_240,"blockchain",(allocator<char> *)&stack0xfffffffffffffc2f);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x10,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_240);
      std::__cxx11::string::string<std::allocator<char>>
                (local_260,"blockchain",(allocator<char> *)&stack0xfffffffffffffc2e);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x11,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_260);
      std::__cxx11::string::string<std::allocator<char>>
                (local_280,"blockchain",(allocator<char> *)&stack0xfffffffffffffc2d);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x12,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_280);
      std::__cxx11::string::string<std::allocator<char>>
                (local_2a0,"blockchain",(allocator<char> *)&stack0xfffffffffffffc2c);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x13,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_2a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_2c0,"blockchain",(allocator<char> *)&stack0xfffffffffffffc2b);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x14,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_2c0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_2e0,"blockchain",(allocator<char> *)&stack0xfffffffffffffc2a);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x15,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_2e0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_300,"blockchain",(allocator<char> *)&stack0xfffffffffffffc29);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x16,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_300);
      std::__cxx11::string::string<std::allocator<char>>
                (local_320,"hidden",(allocator<char> *)&stack0xfffffffffffffc28);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x17,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_320);
      std::__cxx11::string::string<std::allocator<char>>
                (local_340,"hidden",(allocator<char> *)&stack0xfffffffffffffc27);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x18,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_340);
      std::__cxx11::string::string<std::allocator<char>>
                (local_360,"hidden",(allocator<char> *)&stack0xfffffffffffffc26);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x19,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_360);
      std::__cxx11::string::string<std::allocator<char>>
                (local_380,"hidden",(allocator<char> *)&stack0xfffffffffffffc25);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x1a,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_380);
      std::__cxx11::string::string<std::allocator<char>>
                (local_3a0,"hidden",(allocator<char> *)&stack0xfffffffffffffc24);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x1b,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_3a0);
      std::__cxx11::string::string<std::allocator<char>>
                (local_3c0,"hidden",(allocator<char> *)&stack0xfffffffffffffc23);
      CRPCCommand::CRPCCommand
                (RegisterBlockchainRPCCommands::commands + 0x1c,in_stack_fffffffffffffc18,
                 (RpcMethodFnType)local_3c0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_300);
      std::__cxx11::string::~string(local_2e0);
      std::__cxx11::string::~string(local_2c0);
      std::__cxx11::string::~string(local_2a0);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_220);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1a0);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_160);
      std::__cxx11::string::~string(local_140);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_40);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterBlockchainRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterBlockchainRPCCommands::commands;
  for (lVar2 = 0xe80; lVar2 != 0; lVar2 = lVar2 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterBlockchainRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"blockchain", &getblockchaininfo},
        {"blockchain", &getchaintxstats},
        {"blockchain", &getblockstats},
        {"blockchain", &getbestblockhash},
        {"blockchain", &getblockcount},
        {"blockchain", &getblock},
        {"blockchain", &getblockfrompeer},
        {"blockchain", &getblockhash},
        {"blockchain", &getblockheader},
        {"blockchain", &getchaintips},
        {"blockchain", &getdifficulty},
        {"blockchain", &getdeploymentinfo},
        {"blockchain", &gettxout},
        {"blockchain", &gettxoutsetinfo},
        {"blockchain", &pruneblockchain},
        {"blockchain", &verifychain},
        {"blockchain", &preciousblock},
        {"blockchain", &scantxoutset},
        {"blockchain", &scanblocks},
        {"blockchain", &getblockfilter},
        {"blockchain", &dumptxoutset},
        {"blockchain", &loadtxoutset},
        {"blockchain", &getchainstates},
        {"hidden", &invalidateblock},
        {"hidden", &reconsiderblock},
        {"hidden", &waitfornewblock},
        {"hidden", &waitforblock},
        {"hidden", &waitforblockheight},
        {"hidden", &syncwithvalidationinterfacequeue},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}